

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor.cpp
# Opt level: O0

int __thiscall
booster::aio::epoll_reactor::select
          (epoll_reactor *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  bool bVar1;
  undefined7 extraout_var;
  reference pvVar2;
  int event;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar3;
  
  event = (int)__readfds;
  bVar1 = base_fast_reactor::check
                    ((base_fast_reactor *)__writefds,(int)((ulong)this >> 0x20),
                     (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  pvVar2 = (reference)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_base_fast_reactor).events_,(long)__nfds);
    if ((*pvVar2 == 0) || (event != 0)) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(this->super_base_fast_reactor).events_,(long)__nfds);
      if ((*pvVar2 == 0) && (event != 0)) {
        uVar3 = __nfds;
        to_poll_events(this,event);
        write_flag((epoll_reactor *)CONCAT44(uVar3,event),(int)((ulong)__writefds >> 0x20),
                   (int)__writefds,(int)((ulong)this >> 0x20),
                   (int *)CONCAT44(__nfds,in_stack_ffffffffffffffd8));
      }
      else {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(this->super_base_fast_reactor).events_,(long)__nfds);
        uVar3 = __nfds;
        if (*pvVar2 != event) {
          to_poll_events(this,event);
          write_flag((epoll_reactor *)CONCAT44(uVar3,event),(int)((ulong)__writefds >> 0x20),
                     (int)__writefds,(int)((ulong)this >> 0x20),
                     (int *)CONCAT44(in_stack_ffffffffffffffdc,__nfds));
        }
      }
    }
    else {
      write_flag((epoll_reactor *)((ulong)(uint)__nfds << 0x20),(int)((ulong)__writefds >> 0x20),
                 (int)__writefds,(int)((ulong)this >> 0x20),
                 (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      uVar3 = __nfds;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_base_fast_reactor).events_,(long)(int)uVar3);
    *pvVar2 = event;
  }
  return (int)pvVar2;
}

Assistant:

virtual void select(native_type fd,int flags,int &error)
		{
			if(!check(fd,error))
				return;
			if(events_[fd]!=0 && flags==0)
				write_flag(fd,EPOLL_CTL_DEL,0,error);
			else if(events_[fd]==0 && flags!=0)
				write_flag(fd,EPOLL_CTL_ADD,to_poll_events(flags),error);
			else if(events_[fd]!=flags)
				write_flag(fd,EPOLL_CTL_MOD,to_poll_events(flags),error);
			events_[fd]=flags;

		}